

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O3

void __thiscall
FastPForLib::Simple9<true,_false>::encodeArray
          (Simple9<true,_false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint extraout_EAX;
  runtime_error *prVar2;
  undefined8 extraout_RAX;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar6 = out + 1;
  *out = (uint32_t)length;
  if (0x1b < length) {
    do {
      uVar1 = *in;
      if (uVar1 < 2) {
        uVar8 = 0xffffffffffffffff;
        do {
          if (uVar8 == 0x1a) goto LAB_0012ea3a;
          lVar7 = uVar8 + 2;
          uVar8 = uVar8 + 1;
        } while (in[lVar7] < 2);
        if (uVar8 < 0x1b) goto LAB_0012e9c5;
LAB_0012ea3a:
        *puVar6 = 0;
        lVar7 = 0;
        uVar1 = 0;
        do {
          uVar1 = uVar1 * 2 | *(uint *)((long)in + lVar7);
          lVar7 = lVar7 + 4;
          *puVar6 = uVar1;
        } while ((int)lVar7 != 0x70);
        in = (uint32_t *)((long)in + lVar7);
        lVar7 = -0x1c;
      }
      else {
LAB_0012e9c5:
        if (uVar1 < 4) {
          uVar8 = 0xffffffffffffffff;
          do {
            if (uVar8 == 0xc) goto LAB_0012ea8d;
            lVar7 = uVar8 + 2;
            uVar8 = uVar8 + 1;
          } while (in[lVar7] < 4);
          if (0xc < uVar8) {
LAB_0012ea8d:
            uVar1 = 1;
            lVar7 = 0;
            *puVar6 = 1;
            do {
              uVar1 = uVar1 << 2 | *(uint *)((long)in + lVar7);
              lVar7 = lVar7 + 4;
              *puVar6 = uVar1;
            } while ((int)lVar7 != 0x38);
            in = (uint32_t *)((long)in + lVar7);
            lVar7 = -0xe;
            goto LAB_0012ec70;
          }
        }
        if (uVar1 < 8) {
          uVar8 = 0xffffffffffffffff;
          do {
            if (uVar8 == 7) goto LAB_0012eae4;
            lVar7 = uVar8 + 2;
            uVar8 = uVar8 + 1;
          } while (in[lVar7] < 8);
          if (uVar8 < 8) goto LAB_0012e9d7;
LAB_0012eae4:
          uVar1 = 2;
          lVar7 = 0;
          *puVar6 = 2;
          do {
            uVar1 = uVar1 << 3 | *(uint *)((long)in + lVar7);
            lVar7 = lVar7 + 4;
            *puVar6 = uVar1;
          } while ((int)lVar7 != 0x24);
          in = (uint32_t *)((long)in + lVar7);
          uVar1 = uVar1 * 2;
          lVar7 = -9;
        }
        else {
LAB_0012e9d7:
          if (uVar1 < 0x10) {
            uVar8 = 0xffffffffffffffff;
            do {
              if (uVar8 == 5) goto LAB_0012eb3c;
              lVar7 = uVar8 + 2;
              uVar8 = uVar8 + 1;
            } while (in[lVar7] < 0x10);
            if (5 < uVar8) {
LAB_0012eb3c:
              uVar1 = 3;
              lVar7 = 0;
              *puVar6 = 3;
              do {
                uVar1 = uVar1 << 4 | *(uint *)((long)in + lVar7);
                lVar7 = lVar7 + 4;
                *puVar6 = uVar1;
              } while ((int)lVar7 != 0x1c);
              in = (uint32_t *)((long)in + lVar7);
              lVar7 = -7;
              goto LAB_0012ec70;
            }
          }
          if (uVar1 < 0x20) {
            uVar8 = 0xffffffffffffffff;
            do {
              if (uVar8 == 3) goto LAB_0012eb93;
              lVar7 = uVar8 + 2;
              uVar8 = uVar8 + 1;
            } while (in[lVar7] < 0x20);
            if (3 < uVar8) {
LAB_0012eb93:
              uVar1 = 4;
              lVar7 = 0;
              *puVar6 = 4;
              do {
                uVar1 = uVar1 << 5 | *(uint *)((long)in + lVar7);
                lVar7 = lVar7 + 4;
                *puVar6 = uVar1;
              } while ((int)lVar7 != 0x14);
              in = (uint32_t *)((long)in + lVar7);
              uVar1 = uVar1 << 3;
              lVar7 = -5;
              goto LAB_0012ec6e;
            }
          }
          if (uVar1 < 0x80) {
            uVar8 = 0xffffffffffffffff;
            do {
              if (uVar8 == 2) goto LAB_0012ebef;
              lVar7 = uVar8 + 2;
              uVar8 = uVar8 + 1;
            } while (in[lVar7] < 0x80);
            if (2 < uVar8) {
LAB_0012ebef:
              uVar1 = 5;
              lVar7 = 0;
              *puVar6 = 5;
              do {
                uVar1 = uVar1 << 7 | *(uint *)((long)in + lVar7);
                lVar7 = lVar7 + 4;
                *puVar6 = uVar1;
              } while ((int)lVar7 != 0x10);
              in = (uint32_t *)((long)in + lVar7);
              lVar7 = -4;
              goto LAB_0012ec70;
            }
          }
          if (uVar1 < 0x200) {
            if ((0x1ff < in[1]) || (0x1ff < in[2])) goto LAB_0012ec2f;
            uVar1 = 6;
            lVar7 = 0;
            *puVar6 = 6;
            do {
              uVar1 = uVar1 << 9 | *(uint *)((long)in + lVar7);
              lVar7 = lVar7 + 4;
              *puVar6 = uVar1;
            } while ((int)lVar7 != 0xc);
            in = (uint32_t *)((long)in + lVar7);
            uVar1 = uVar1 * 2;
            lVar7 = -3;
          }
          else {
            if (uVar1 < 0x4000) {
LAB_0012ec2f:
              if (in[1] < 0x4000) {
                *puVar6 = 7;
                lVar7 = -2;
                uVar1 = *in;
                *puVar6 = uVar1 | 0x1c000;
                uVar1 = (uVar1 | 0x1c000) << 0xe | in[1];
                in = in + 2;
                goto LAB_0012ec6e;
              }
            }
            else if (0xfffffff < uVar1) goto LAB_0012f096;
            *puVar6 = 8;
            lVar7 = -1;
            uVar1 = *in;
            in = in + 1;
            uVar1 = uVar1 | 0x80000000;
          }
        }
LAB_0012ec6e:
        *puVar6 = uVar1;
      }
LAB_0012ec70:
      length = length + lVar7;
      puVar6 = puVar6 + 1;
    } while (0x1b < length);
  }
  do {
    if (length == 0) {
      *nvalue = (long)puVar6 - (long)out >> 2;
      return;
    }
    uVar1 = *in;
    uVar8 = 0x1c;
    if (length < 0x1c) {
      uVar8 = length;
    }
    if (uVar1 < 2) {
      uVar5 = 1;
      do {
        uVar9 = uVar5;
        if (uVar8 == uVar9) break;
        uVar5 = uVar9 + 1;
      } while (in[uVar9] < 2);
      if (uVar9 < uVar8) goto LAB_0012ecfd;
      *puVar6 = 0;
      uVar5 = 1;
      if (1 < (uint)uVar8) {
        uVar5 = uVar8 & 0xffffffff;
      }
      uVar1 = 0;
      do {
        uVar1 = uVar1 * 2 | *in;
        in = in + 1;
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
        *puVar6 = uVar1;
      } while (uVar4 != 0);
      cVar3 = -(char)uVar8;
LAB_0012eff7:
      uVar1 = uVar1 << ((byte)(cVar3 + 0x1c) & 0x1f);
    }
    else {
LAB_0012ecfd:
      uVar8 = 0xe;
      if (length < 0xe) {
        uVar8 = length;
      }
      if (uVar1 < 4) {
        uVar5 = 1;
        do {
          uVar9 = uVar5;
          if (uVar8 == uVar9) break;
          uVar5 = uVar9 + 1;
        } while (in[uVar9] < 4);
        if (uVar9 < uVar8) goto LAB_0012ed31;
        uVar1 = 1;
        uVar5 = 1;
        if (1 < (uint)uVar8) {
          uVar5 = uVar8 & 0xffffffff;
        }
        *puVar6 = 1;
        do {
          uVar1 = uVar1 << 2 | *in;
          in = in + 1;
          uVar4 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar4;
          *puVar6 = uVar1;
        } while (uVar4 != 0);
        cVar3 = (char)uVar8 * '\x02';
LAB_0012ef50:
        cVar3 = -cVar3;
LAB_0012ef56:
        uVar1 = uVar1 << ((byte)(cVar3 + 0x1c) & 0x1f);
      }
      else {
LAB_0012ed31:
        uVar8 = 9;
        if (length < 9) {
          uVar8 = length;
        }
        if (uVar1 < 8) {
          uVar5 = 1;
          do {
            uVar9 = uVar5;
            if (uVar8 == uVar9) break;
            uVar5 = uVar9 + 1;
          } while (in[uVar9] < 8);
          if (uVar9 < uVar8) goto LAB_0012ed65;
          uVar1 = 2;
          *puVar6 = 2;
          uVar5 = 1;
          if (1 < (uint)uVar8) {
            uVar5 = uVar8 & 0xffffffff;
          }
          do {
            uVar1 = uVar1 << 3 | *in;
            in = in + 1;
            uVar4 = (int)uVar5 - 1;
            uVar5 = (ulong)uVar4;
            *puVar6 = uVar1;
          } while (uVar4 != 0);
          cVar3 = (char)uVar8 * '\x03';
LAB_0012eff2:
          cVar3 = -cVar3;
          goto LAB_0012eff7;
        }
LAB_0012ed65:
        uVar8 = 7;
        if (length < 7) {
          uVar8 = length;
        }
        if (uVar1 < 0x10) {
          uVar5 = 1;
          do {
            uVar9 = uVar5;
            if (uVar8 == uVar9) break;
            uVar5 = uVar9 + 1;
          } while (in[uVar9] < 0x10);
          if (uVar8 <= uVar9) {
            uVar1 = 3;
            *puVar6 = 3;
            uVar5 = 1;
            if (1 < (uint)uVar8) {
              uVar5 = uVar8 & 0xffffffff;
            }
            do {
              uVar1 = uVar1 << 4 | *in;
              in = in + 1;
              uVar4 = (int)uVar5 - 1;
              uVar5 = (ulong)uVar4;
              *puVar6 = uVar1;
            } while (uVar4 != 0);
            cVar3 = (char)uVar8 * '\x04';
            goto LAB_0012ef50;
          }
        }
        uVar8 = 5;
        if (length < 5) {
          uVar8 = length;
        }
        if (uVar1 < 0x20) {
          uVar5 = 1;
          do {
            uVar9 = uVar5;
            if (uVar8 == uVar9) break;
            uVar5 = uVar9 + 1;
          } while (in[uVar9] < 0x20);
          if (uVar8 <= uVar9) {
            uVar1 = 4;
            *puVar6 = 4;
            uVar5 = 1;
            if (1 < (uint)uVar8) {
              uVar5 = uVar8 & 0xffffffff;
            }
            do {
              uVar1 = uVar1 << 5 | *in;
              in = in + 1;
              uVar4 = (int)uVar5 - 1;
              uVar5 = (ulong)uVar4;
              *puVar6 = uVar1;
            } while (uVar4 != 0);
            cVar3 = (char)uVar8 * '\x05';
            goto LAB_0012eff2;
          }
        }
        uVar8 = 4;
        if (length < 4) {
          uVar8 = length;
        }
        if (uVar1 < 0x80) {
          uVar5 = 1;
          do {
            uVar9 = uVar5;
            if (uVar8 == uVar9) break;
            uVar5 = uVar9 + 1;
          } while (in[uVar9] < 0x80);
          if (uVar8 <= uVar9) {
            uVar1 = 5;
            *puVar6 = 5;
            uVar5 = 1;
            if (1 < (uint)uVar8) {
              uVar5 = uVar8 & 0xffffffff;
            }
            do {
              uVar1 = uVar1 << 7 | *in;
              in = in + 1;
              uVar4 = (int)uVar5 - 1;
              uVar5 = (ulong)uVar4;
              *puVar6 = uVar1;
            } while (uVar4 != 0);
            cVar3 = (char)uVar8 * -7;
            goto LAB_0012ef56;
          }
        }
        uVar8 = 3;
        if (length < 3) {
          uVar8 = length;
        }
        if (uVar1 < 0x200) {
          uVar5 = 1;
          do {
            uVar9 = uVar5;
            if (uVar8 == uVar9) break;
            uVar5 = uVar9 + 1;
          } while (in[uVar9] < 0x200);
          if (uVar8 <= uVar9) {
            uVar1 = 6;
            *puVar6 = 6;
            uVar5 = 1;
            if (1 < (uint)uVar8) {
              uVar5 = uVar8 & 0xffffffff;
            }
            do {
              uVar1 = uVar1 << 9 | *in;
              in = in + 1;
              uVar4 = (int)uVar5 - 1;
              uVar5 = (ulong)uVar4;
              *puVar6 = uVar1;
            } while (uVar4 != 0);
            cVar3 = (char)uVar8 * '\t';
            goto LAB_0012eff2;
          }
        }
        uVar8 = 2;
        if (length < 2) {
          uVar8 = length;
        }
        if (uVar1 < 0x4000) {
          uVar5 = 1;
          do {
            uVar9 = uVar5;
            if (uVar8 == uVar9) break;
            uVar5 = uVar9 + 1;
          } while (in[uVar9] < 0x4000);
          if (uVar8 <= uVar9) {
            uVar1 = 7;
            *puVar6 = 7;
            uVar8 = (ulong)((length != 1) + 1);
            uVar5 = uVar8;
            do {
              uVar1 = uVar1 << 0xe | *in;
              in = in + 1;
              uVar4 = (int)uVar5 - 1;
              uVar5 = (ulong)uVar4;
              *puVar6 = uVar1;
            } while (uVar4 != 0);
            cVar3 = (char)(-0xe << (length != 1));
            goto LAB_0012eff7;
          }
        }
        if (0xfffffff < uVar1) {
          fprintf(_stderr,"Input\'s out of range: %u\n",(ulong)uVar1);
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar2,"You tried to apply Simple9 to an incompatible set of integers.");
          Simple9<true,false>::encodeArray(prVar2);
          uVar1 = extraout_EAX;
LAB_0012f096:
          fprintf(_stderr,"Input\'s out of range: %u\n",(ulong)uVar1);
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar2,"You tried to apply Simple9 to an incompatible set of integers.");
          Simple9<true,false>::encodeArray(prVar2);
          __cxa_free_exception(prVar2);
          _Unwind_Resume(extraout_RAX);
        }
        *puVar6 = 8;
        uVar8 = 1;
        uVar1 = *in;
        in = in + 1;
        uVar1 = uVar1 | 0x80000000;
      }
    }
    *puVar6 = uVar1;
    puVar6 = puVar6 + 1;
    length = length - (uVar8 & 0xffffffff);
  } while( true );
}

Assistant:

void Simple9<MarkLength, hacked>::encodeArray(const uint32_t *in,
                                              const size_t length,
                                              uint32_t *out, size_t &nvalue) {
  uint32_t NumberOfValuesCoded;
  const uint32_t *const initout(out);
  if (MarkLength)
    *(out++) = uint32_t(length);
  size_t ValuesRemaining(length);
  // precompute
  const bool becareful = false;

  while (ValuesRemaining >= 28) {
    if (hacked && trymefull<28, 0>(in)) {
      out[0] = 9 << (32 - SIMPLE9_LOGDESC);
      NumberOfValuesCoded = 28;
      in += 28;
    } else if (trymefull<28, 1>(in)) {
      out[0] = 0;
      NumberOfValuesCoded = 28;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 1);
      if (becareful)
        assert(which(out) == 0);
    } else if (trymefull<14, 2>(in)) {
      out[0] = 1;
      NumberOfValuesCoded = 14;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 2);
      if (becareful)
        assert(which(out) == 1);
    } else if (trymefull<9, 3>(in)) {
      out[0] = 2;
      NumberOfValuesCoded = 9;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 3);
      *out <<= 28 - 3 * 9;
      if (becareful)
        assert(which(out) == 2);
    } else if (trymefull<7, 4>(in)) {
      out[0] = 3;

      NumberOfValuesCoded = 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 4);
      if (becareful)
        assert(which(out) == 7);
    } else if (trymefull<5, 5>(in)) {
      out[0] = 4;

      NumberOfValuesCoded = 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 5);
      *out <<= 28 - 5 * 5;
      if (becareful)
        assert(which(out) == 4);
    } else if (trymefull<4, 7>(in)) {
      out[0] = 5;
      NumberOfValuesCoded = 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 7);

      if (becareful)
        assert(which(out) == 5);
    } else if (trymefull<3, 9>(in)) {
      out[0] = 6;
      NumberOfValuesCoded = 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 9);
      *out <<= 28 - 9 * 3;
      if (becareful)
        assert(which(out) == 6);
    } else if (trymefull<2, 14>(in)) {
      out[0] = 7;

      NumberOfValuesCoded = 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 14);

      if (becareful)
        assert(which(out) == 14);
    } else {
      if ((*in >> 28) > 0) {
        fprintf(stderr, "Input's out of range: %u\n", *in);
        throw std::runtime_error(
            "You tried to apply Simple9 to an incompatible set of integers.");
      }

      out[0] = 8;

      NumberOfValuesCoded = 1;
      bit_writer(out, *in++, 28);
      if (becareful)
        assert(which(out) == 15);
    }

    ++out;

    ValuesRemaining -= NumberOfValuesCoded;
  }
  while (ValuesRemaining > 0) {
    if (hacked && trymefull<28, 0>(in)) {
      out[0] = 9 << (32 - SIMPLE9_LOGDESC);
      NumberOfValuesCoded = (ValuesRemaining < 28) ? uint32_t(ValuesRemaining) : 28;
      in += NumberOfValuesCoded;
    } else if (tryme<28, 1>(in, ValuesRemaining)) {
      out[0] = 0;

      NumberOfValuesCoded = (ValuesRemaining < 28) ? uint32_t(ValuesRemaining) : 28;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 1);
      *out <<= 28 - NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 0);
    } else if (tryme<14, 2>(in, ValuesRemaining)) {
      out[0] = 1;

      NumberOfValuesCoded = (ValuesRemaining < 14) ? uint32_t(ValuesRemaining) : 14;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 2);
      *out <<= 28 - 2 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 1);
    } else if (tryme<9, 3>(in, ValuesRemaining)) {
      out[0] = 2;
      NumberOfValuesCoded = (ValuesRemaining < 9) ? uint32_t(ValuesRemaining) : 9;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 3);
      *out <<= 28 - 3 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 2);
    } else if (tryme<7, 4>(in, ValuesRemaining)) {
      out[0] = 3;

      NumberOfValuesCoded = (ValuesRemaining < 7) ? uint32_t(ValuesRemaining) : 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 4);
      *out <<= 28 - 4 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 7);
    } else if (tryme<5, 5>(in, ValuesRemaining)) {
      out[0] = 4;

      NumberOfValuesCoded = (ValuesRemaining < 5) ? uint32_t(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 5);
      *out <<= 28 - 5 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 4);
    } else if (tryme<4, 7>(in, ValuesRemaining)) {
      out[0] = 5;
      NumberOfValuesCoded = (ValuesRemaining < 4) ? uint32_t(ValuesRemaining) : 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 7);

      *out <<= 28 - 7 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 5);
    } else if (tryme<3, 9>(in, ValuesRemaining)) {
      out[0] = 6;
      NumberOfValuesCoded = (ValuesRemaining < 3) ? uint32_t(ValuesRemaining) : 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 9);
      *out <<= 28 - 9 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 6);
    } else if (tryme<2, 14>(in, ValuesRemaining)) {
      out[0] = 7;
      NumberOfValuesCoded = (ValuesRemaining < 2) ? uint32_t(ValuesRemaining) : 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 14);
      *out <<= 28 - 14 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 14);
    } else {
      if ((*in >> 28) > 0) {
        fprintf(stderr, "Input's out of range: %u\n", *in);
        throw std::runtime_error(
            "You tried to apply Simple9 to an incompatible set of integers.");
      }
      out[0] = 8;
      NumberOfValuesCoded = 1;
      bit_writer(out, *in++, 28);
      if (becareful)
        assert(which(out) == 15);
    }
    ++out;
    ValuesRemaining -= NumberOfValuesCoded;
  }
  nvalue = out - initout;
}